

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_value.cpp
# Opt level: O0

Am_Value * __thiscall Am_Value::operator=(Am_Value *this,Am_Value *in_value)

{
  bool bVar1;
  Am_Value *in_value_local;
  Am_Value *this_local;
  
  bVar1 = Am_Type_Is_Ref_Counted(this->type);
  if ((bVar1) && ((this->value).wrapper_value != (Am_Wrapper *)0x0)) {
    Am_Wrapper::Release((this->value).wrapper_value);
  }
  this->type = in_value->type;
  this->value = in_value->value;
  bVar1 = Am_Type_Is_Ref_Counted(this->type);
  if ((bVar1) && ((this->value).wrapper_value != (Am_Wrapper *)0x0)) {
    Am_Wrapper::Note_Reference((this->value).wrapper_value);
  }
  return this;
}

Assistant:

Am_Value &
Am_Value::operator=(const Am_Value &in_value)
{
  if (Am_Type_Is_Ref_Counted(type) && value.wrapper_value)
    value.wrapper_value->Release();
  type = in_value.type;
  value = in_value.value;
  if (Am_Type_Is_Ref_Counted(type) && value.wrapper_value)
    value.wrapper_value->Note_Reference();
  return *this;
}